

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

thanm_instr_t * thanm_instr_new_raw(anm_instr_t *raw_instr,char *format)

{
  thanm_instr_t *ptVar1;
  thanm_instr_t *ret;
  char *format_local;
  anm_instr_t *raw_instr_local;
  
  ptVar1 = thanm_instr_new();
  ptVar1->type = 0;
  ptVar1->time = raw_instr->time;
  ptVar1->id = raw_instr->type;
  ptVar1->size = (uint)raw_instr->length;
  ptVar1->param_mask = raw_instr->param_mask;
  thanm_make_params(raw_instr,&ptVar1->params,format);
  return ptVar1;
}

Assistant:

static thanm_instr_t*
thanm_instr_new_raw(
    anm_instr_t* raw_instr,
    const char* format
) {
    thanm_instr_t* ret = thanm_instr_new();
    ret->type = THANM_INSTR_INSTR;
    ret->time = raw_instr->time;
    ret->id = raw_instr->type;
    ret->size = raw_instr->length;
    ret->param_mask = raw_instr->param_mask;
    thanm_make_params(raw_instr, &ret->params, format);
    return ret;
}